

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ci.cpp
# Opt level: O0

void msd_ci(uchar **strings,size_t n)

{
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  size_t n_local;
  uchar **strings_local;
  
  uVar1 = std::numeric_limits<long>::max();
  if (uVar1 < n) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
    poVar2 = std::operator<<(poVar2,"msd_ci");
    poVar2 = std::operator<<(poVar2,"(): too many input strings: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
    poVar2 = std::operator<<(poVar2," > ");
    lVar3 = std::numeric_limits<long>::max();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    abort();
  }
  msd_ci<unsigned_long>(strings,n,0);
  return;
}

Assistant:

void msd_ci(unsigned char** strings, size_t n)
{
	if (n > size_t(std::numeric_limits<ssize_t>::max())) {
		std::cerr << "ERROR: "
			<< __func__ << "(): too many input strings: "
			<< n << " > " << std::numeric_limits<ssize_t>::max()
			<< std::endl;
		abort();
	}
	msd_ci<size_t>(strings, n, 0);
}